

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O2

int __thiscall Httpdata::handle_event(Httpdata *this)

{
  enable_shared_from_this<channel> *__r;
  uint uVar1;
  TimeRoundItem<channel> *this_00;
  SP_TimeRoundItemNode<channel> *this_01;
  shared_ptr<TimeRoundItem<channel>_> sp_time_round_item;
  shared_ptr<channel> local_88;
  channel *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_58 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Head_base<0UL,_channel_*,_false> local_48;
  Fun local_40;
  
  uVar1 = (this->super_channel).Revent;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 4) != 0) {
      (*(this->super_channel)._vptr_channel[5])(this);
    }
  }
  else {
    (*(this->super_channel)._vptr_channel[4])(this);
    if (((this->super_channel).accept_epoll == (Epoll *)0x0) &&
       (0 < (this->super_channel).read_length)) {
      handle_http(this,(this->super_channel).read_buff);
      (*(this->super_channel)._vptr_channel[7])(this);
      if (((this->super_channel).time_round != (TimeRound<channel> *)0x0) &&
         ((this->super_channel).field_0x8c == '\x01')) {
        this_00 = (TimeRoundItem<channel> *)operator_new(0x38);
        __r = &(this->super_channel).super_enable_shared_from_this<channel>;
        std::__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<channel,void>
                  ((__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                   (__weak_ptr<channel,_(__gnu_cxx::_Lock_policy)2> *)__r);
        local_58 = (undefined1  [8])channel::Close;
        local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_48._M_head_impl = local_78;
        std::function<void()>::function<std::_Bind<void(channel::*(channel*))()>,void>
                  ((function<void()> *)&local_40,(_Bind<void_(channel::*(channel_*))()> *)local_58);
        std::__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<channel,void>
                  ((__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                   (__weak_ptr<channel,_(__gnu_cxx::_Lock_policy)2> *)__r);
        TimeRoundItem<channel>::TimeRoundItem(this_00,5,&local_40,&local_88);
        std::__shared_ptr<TimeRoundItem<channel>,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<TimeRoundItem<channel>,void>
                  ((__shared_ptr<TimeRoundItem<channel>,(__gnu_cxx::_Lock_policy)2> *)
                   &sp_time_round_item,this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_88.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::_Function_base::~_Function_base(&local_40.super__Function_base);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
        std::__weak_ptr<TimeRoundItem<channel>,(__gnu_cxx::_Lock_policy)2>::
        __weak_ptr<TimeRoundItem<channel>,void>
                  ((__weak_ptr<TimeRoundItem<channel>,(__gnu_cxx::_Lock_policy)2> *)local_58,
                   &sp_time_round_item.
                    super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>);
        std::__weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->super_channel).wp_time_round_item.
                    super___weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>,
                   (__weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2> *)local_58);
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_50);
        this_01 = (SP_TimeRoundItemNode<channel> *)operator_new(0x20);
        std::__shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,
                   &sp_time_round_item.
                    super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>);
        SP_TimeRoundItemNode<channel>::SP_TimeRoundItemNode(this_01,(SP_TimeRoundItem *)&local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
        TimeRound<channel>::AddTimeRoundItemNode((this->super_channel).time_round,this_01);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sp_time_round_item.
                    super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
  }
  (this->super_channel).Revent = 0;
  return 0;
}

Assistant:

int Httpdata::handle_event()
{
    if(Revent & EPOLLIN)
    {
        HandleRead();
        if(accept_epoll == nullptr)
        {
            //cout<<"recv data from client: "<<fd<<" "<<buff<<endl;
            //有读取到数据才需要处理
            if(read_length > 0)
            {
                handle_http(read_buff);
                SeparateTimer();
                if(time_round != nullptr && Keep_Alive)
                {
                    std::shared_ptr<TimeRoundItem<channel>> sp_time_round_item(new TimeRoundItem<channel>(5,bind(&Httpdata::Close,shared_from_this().get()),shared_from_this()));
                    wp_time_round_item = std::weak_ptr<TimeRoundItem<channel>>(sp_time_round_item);
                    SP_TimeRoundItemNode<channel>* sp_time_round_item_node = new SP_TimeRoundItemNode<channel>(sp_time_round_item);
                    time_round->AddTimeRoundItemNode(sp_time_round_item_node);
                }
            }
        }
    }
    else if(Revent & EPOLLOUT)
    {
        HandleWrite();
    }
    Revent = 0;
    return 0;
}